

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O0

void scan_bitstream(TrackData *trackdata)

{
  Encoding EVar1;
  initializer_list<Encoding> __l;
  initializer_list<Encoding> __l_00;
  bool bVar2;
  reference pEVar3;
  Track *this;
  iterator iStack_100;
  Encoding encoding;
  iterator __end1;
  iterator __begin1;
  vector<Encoding,_std::allocator<Encoding>_> *__range1;
  undefined1 local_d8 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>_>
  local_c8;
  __normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_> local_c0;
  const_iterator local_b8;
  Encoding *local_b0;
  undefined1 local_a8 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>_>
  local_98;
  reverse_iterator<__gnu_cxx::__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>_>
  local_90;
  __normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_> local_88;
  const_iterator local_80;
  Encoding local_78 [6];
  iterator local_60;
  undefined8 local_58;
  Encoding local_3c;
  iterator local_38;
  undefined8 local_30;
  undefined1 local_28 [8];
  vector<Encoding,_std::allocator<Encoding>_> encodings;
  TrackData *trackdata_local;
  
  encodings.super__Vector_base<Encoding,_std::allocator<Encoding>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)trackdata;
  std::vector<Encoding,_std::allocator<Encoding>_>::vector
            ((vector<Encoding,_std::allocator<Encoding>_> *)local_28);
  if (opt.encoding == Unknown) {
    local_78[0] = scan_bitstream::last_encoding;
    local_78[1] = 1;
    local_78[2] = 4;
    local_78[3] = 5;
    local_78[4] = 10;
    local_78[5] = 9;
    local_60 = local_78;
    local_58 = 6;
    __l._M_len = 6;
    __l._M_array = local_60;
    std::vector<Encoding,_std::allocator<Encoding>_>::operator=
              ((vector<Encoding,_std::allocator<Encoding>_> *)local_28,__l);
    std::vector<Encoding,_std::allocator<Encoding>_>::rbegin
              ((vector<Encoding,_std::allocator<Encoding>_> *)(local_a8 + 8));
    std::vector<Encoding,_std::allocator<Encoding>_>::rend
              ((vector<Encoding,_std::allocator<Encoding>_> *)local_a8);
    std::
    find<std::reverse_iterator<__gnu_cxx::__normal_iterator<Encoding*,std::vector<Encoding,std::allocator<Encoding>>>>,Encoding>
              (&local_98,
               (reverse_iterator<__gnu_cxx::__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>_>
                *)(local_a8 + 8),(Encoding *)local_a8);
    std::
    next<std::reverse_iterator<__gnu_cxx::__normal_iterator<Encoding*,std::vector<Encoding,std::allocator<Encoding>>>>>
              (&local_90,(difference_type)&local_98);
    local_88._M_current =
         (Encoding *)
         std::
         reverse_iterator<__gnu_cxx::__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>_>
         ::base(&local_90);
    __gnu_cxx::__normal_iterator<Encoding_const*,std::vector<Encoding,std::allocator<Encoding>>>::
    __normal_iterator<Encoding*>
              ((__normal_iterator<Encoding_const*,std::vector<Encoding,std::allocator<Encoding>>> *)
               &local_80,&local_88);
    local_b0 = (Encoding *)
               std::vector<Encoding,_std::allocator<Encoding>_>::erase
                         ((vector<Encoding,_std::allocator<Encoding>_> *)local_28,local_80);
    if (scan_bitstream::last_encoding == FM) {
      std::vector<Encoding,_std::allocator<Encoding>_>::rbegin
                ((vector<Encoding,_std::allocator<Encoding>_> *)(local_d8 + 8));
      std::vector<Encoding,_std::allocator<Encoding>_>::rend
                ((vector<Encoding,_std::allocator<Encoding>_> *)local_d8);
      std::
      find<std::reverse_iterator<__gnu_cxx::__normal_iterator<Encoding*,std::vector<Encoding,std::allocator<Encoding>>>>,Encoding>
                (&local_c8,
                 (reverse_iterator<__gnu_cxx::__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>_>
                  *)(local_d8 + 8),(Encoding *)local_d8);
      local_c0._M_current =
           (Encoding *)
           std::
           reverse_iterator<__gnu_cxx::__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>_>
           ::base(&local_c8);
      __gnu_cxx::__normal_iterator<Encoding_const*,std::vector<Encoding,std::allocator<Encoding>>>::
      __normal_iterator<Encoding*>
                ((__normal_iterator<Encoding_const*,std::vector<Encoding,std::allocator<Encoding>>>
                  *)&local_b8,&local_c0);
      std::vector<Encoding,_std::allocator<Encoding>_>::erase
                ((vector<Encoding,_std::allocator<Encoding>_> *)local_28,local_b8);
    }
  }
  else {
    local_3c = opt.encoding;
    local_38 = &local_3c;
    local_30 = 1;
    __l_00._M_len = 1;
    __l_00._M_array = local_38;
    std::vector<Encoding,_std::allocator<Encoding>_>::operator=
              ((vector<Encoding,_std::allocator<Encoding>_> *)local_28,__l_00);
  }
  __end1 = std::vector<Encoding,_std::allocator<Encoding>_>::begin
                     ((vector<Encoding,_std::allocator<Encoding>_> *)local_28);
  iStack_100 = std::vector<Encoding,_std::allocator<Encoding>_>::end
                         ((vector<Encoding,_std::allocator<Encoding>_> *)local_28);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff00),
        EVar1 = scan_bitstream::last_encoding, bVar2) {
    pEVar3 = __gnu_cxx::
             __normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>::
             operator*(&__end1);
    EVar1 = *pEVar3;
    switch(EVar1) {
    case MFM:
    case FM:
    case RX02:
      scan_bitstream_mfm_fm
                ((TrackData *)
                 encodings.super__Vector_base<Encoding,_std::allocator<Encoding>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      break;
    case Amiga:
      scan_bitstream_amiga
                ((TrackData *)
                 encodings.super__Vector_base<Encoding,_std::allocator<Encoding>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      break;
    case GCR:
      scan_bitstream_gcr((TrackData *)
                         encodings.super__Vector_base<Encoding,_std::allocator<Encoding>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      break;
    case Ace:
      scan_bitstream_ace((TrackData *)
                         encodings.super__Vector_base<Encoding,_std::allocator<Encoding>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      break;
    case MX:
      scan_bitstream_mx((TrackData *)
                        encodings.super__Vector_base<Encoding,_std::allocator<Encoding>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      break;
    case Agat:
      scan_bitstream_agat((TrackData *)
                          encodings.super__Vector_base<Encoding,_std::allocator<Encoding>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      break;
    case Apple:
      scan_bitstream_apple
                ((TrackData *)
                 encodings.super__Vector_base<Encoding,_std::allocator<Encoding>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      break;
    case Victor:
      scan_bitstream_victor
                ((TrackData *)
                 encodings.super__Vector_base<Encoding,_std::allocator<Encoding>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      break;
    case Vista:
      scan_bitstream_vista
                ((TrackData *)
                 encodings.super__Vector_base<Encoding,_std::allocator<Encoding>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/BitstreamDecoder.cpp"
                    ,0xbb,"void scan_bitstream(TrackData &)");
    }
    this = TrackData::track((TrackData *)
                            encodings.super__Vector_base<Encoding,_std::allocator<Encoding>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = Track::empty(this);
    if ((!bVar2) && (opt.multiformat == 0)) break;
    __gnu_cxx::__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>::
    operator++(&__end1);
  }
  scan_bitstream::last_encoding = EVar1;
  std::vector<Encoding,_std::allocator<Encoding>_>::~vector
            ((vector<Encoding,_std::allocator<Encoding>_> *)local_28);
  return;
}

Assistant:

void scan_bitstream(TrackData& trackdata)
{
    static Encoding last_encoding = Encoding::MFM;

    std::vector<Encoding> encodings;
    if (opt.encoding != Encoding::Unknown)
    {
        // Just the one requested format.
        encodings = { opt.encoding };
    }
    else
    {
        // Scan for formats, starting with the last successful encoding.
        encodings = { last_encoding, Encoding::MFM, Encoding::Amiga, Encoding::GCR, Encoding::Victor, Encoding::Apple };
        encodings.erase(std::next(std::find(encodings.rbegin(), encodings.rend(), last_encoding)).base());

        // MFM and FM use the same scanner, so remove the duplicate
        if (last_encoding == Encoding::FM)
            encodings.erase(std::find(encodings.rbegin(), encodings.rend(), Encoding::MFM).base());
    }

    for (auto encoding : encodings)
    {
        switch (encoding)
        {
        case Encoding::MFM:
        case Encoding::FM:
        case Encoding::RX02:
            scan_bitstream_mfm_fm(trackdata);
            break;

        case Encoding::Amiga:
            scan_bitstream_amiga(trackdata);
            break;

            // Apple Disk ][ GCR
        case Encoding::Apple:
            scan_bitstream_apple(trackdata);
            break;

            // Commodore 64 GCR
        case Encoding::GCR:
            scan_bitstream_gcr(trackdata);
            break;

        case Encoding::Ace:
            scan_bitstream_ace(trackdata);
            break;

        case Encoding::MX:
            scan_bitstream_mx(trackdata);
            break;

        case Encoding::Agat:
            scan_bitstream_agat(trackdata);
            break;

        case Encoding::Victor:
            scan_bitstream_victor(trackdata);
            break;

        case Encoding::Vista:
            scan_bitstream_vista(trackdata);
            break;

        default:
            assert(false);
            break;
        }

        // Stop if we found something and we're not scanning multiple formats.
        if (!trackdata.track().empty() && !opt.multiformat)
        {
            // Remember the encoding so we try it first next time
            last_encoding = encoding;
            break;
        }
    }
}